

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

bool slang::ast::Pattern::createPatternVars
               (ASTContext *context,PatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  SyntaxKind SVar1;
  Compilation *this;
  bool bVar2;
  PatternVarSymbol *pPVar3;
  VariablePatternSyntax *varSyntax;
  SourceLocation local_48;
  string_view local_40;
  
  while (SVar1 = (((StructurePatternSyntax *)syntax)->super_PatternSyntax).super_SyntaxNode.kind,
        SVar1 == ParenthesizedPattern) {
    syntax = (PatternSyntax *)
             (((StructurePatternSyntax *)syntax)->members).super_SyntaxListBase._vptr_SyntaxListBase
    ;
  }
  if (SVar1 != StructurePattern) {
    if (SVar1 != TaggedPattern) {
      if (SVar1 == VariablePattern) {
        this = ((context->scope).ptr)->compilation;
        local_40 = parsing::Token::valueText((Token *)&((StructurePatternSyntax *)syntax)->members);
        local_48 = parsing::Token::location((Token *)&((StructurePatternSyntax *)syntax)->members);
        pPVar3 = BumpAllocator::
                 emplace<slang::ast::PatternVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&>
                           (&this->super_BumpAllocator,&local_40,&local_48,targetType);
        local_40._M_len = (size_t)pPVar3;
        (pPVar3->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.
        originatingSyntax = &syntax->super_SyntaxNode;
        SmallVectorBase<slang::ast::PatternVarSymbol_const*>::
        emplace_back<slang::ast::PatternVarSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PatternVarSymbol_const*> *)results,
                   (PatternVarSymbol **)&local_40);
      }
      return true;
    }
    bVar2 = TaggedPattern::createVars(context,(TaggedPatternSyntax *)syntax,targetType,results);
    return bVar2;
  }
  bVar2 = StructurePattern::createVars(context,(StructurePatternSyntax *)syntax,targetType,results);
  return bVar2;
}

Assistant:

bool Pattern::createPatternVars(const ASTContext& context, const PatternSyntax& syntax,
                                const Type& targetType,
                                SmallVector<const PatternVarSymbol*>& results) {
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedPattern:
            return createPatternVars(context, *syntax.as<ParenthesizedPatternSyntax>().pattern,
                                     targetType, results);
        case SyntaxKind::VariablePattern: {
            auto& varSyntax = syntax.as<VariablePatternSyntax>();
            auto var = context.getCompilation().emplace<PatternVarSymbol>(
                varSyntax.variableName.valueText(), varSyntax.variableName.location(), targetType);
            var->setSyntax(varSyntax);
            results.push_back(var);
            break;
        }
        case SyntaxKind::TaggedPattern:
            return TaggedPattern::createVars(context, syntax.as<TaggedPatternSyntax>(), targetType,
                                             results);
        case SyntaxKind::StructurePattern:
            return StructurePattern::createVars(context, syntax.as<StructurePatternSyntax>(),
                                                targetType, results);
        default:
            break;
    }

    return true;
}